

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O0

void anon_unknown.dwarf_13ad8::testCropping(string *fileName)

{
  bool bVar1;
  ostream *poVar2;
  DeepImageChannel *c2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  DeepImageLevel *this_00;
  char *__filename;
  DeepImage img3;
  DeepImage img2;
  Header hdr;
  Rand48 random;
  DeepImage img1;
  undefined4 in_stack_fffffffffffffc38;
  int in_stack_fffffffffffffc3c;
  Box<Imath_2_5::Vec2<int>_> *in_stack_fffffffffffffc40;
  string *in_stack_fffffffffffffc48;
  string *name;
  DeepImageLevel *in_stack_fffffffffffffc50;
  Box2i *in_stack_fffffffffffffc58;
  DeepImage *in_stack_fffffffffffffc60;
  DeepImage *in_stack_fffffffffffffc68;
  allocator<char> *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  Compression in_stack_fffffffffffffc7c;
  undefined4 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc80;
  V2f *in_stack_fffffffffffffc88;
  float in_stack_fffffffffffffc94;
  DeepImage *in_stack_fffffffffffffc98;
  Header *in_stack_fffffffffffffca0;
  string *in_stack_fffffffffffffca8;
  Image *in_stack_fffffffffffffcb0;
  DeepImageChannel *c1;
  undefined1 local_299 [40];
  allocator<char> local_271;
  string local_270 [32];
  Image local_250;
  DataWindowSource in_stack_fffffffffffffe1c;
  DeepImage *in_stack_fffffffffffffe20;
  Header *in_stack_fffffffffffffe28;
  string *in_stack_fffffffffffffe30;
  allocator<char> local_1b9;
  string local_1b8 [100];
  DataWindowSource in_stack_fffffffffffffeac;
  DeepImage *in_stack_fffffffffffffeb0;
  Header *in_stack_fffffffffffffeb8;
  string *in_stack_fffffffffffffec0;
  Vec2<int> local_130;
  Vec2<int> local_128 [3];
  Vec2<float> local_110 [11];
  allocator<char> local_b1;
  string local_b0 [32];
  Vec2<int> local_90;
  Vec2<int> local_88 [3];
  Image local_70;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"cropping an image");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Vec2<int>::Vec2(local_88,10,0x14);
  Imath_2_5::Vec2<int>::Vec2(&local_90,0x6e,0x78);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            ((Box<Imath_2_5::Vec2<int>_> *)in_stack_fffffffffffffc50,
             (Vec2<int> *)in_stack_fffffffffffffc48,&in_stack_fffffffffffffc40->min);
  Imf_2_5::DeepImage::DeepImage
            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
             (LevelMode)((ulong)in_stack_fffffffffffffc50 >> 0x20),
             (LevelRoundingMode)in_stack_fffffffffffffc50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc80,
             (char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70);
  Imf_2_5::Image::insertChannel
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (PixelType)((ulong)in_stack_fffffffffffffca0 >> 0x20),(int)in_stack_fffffffffffffca0,
             (int)((ulong)in_stack_fffffffffffffc98 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffc98 >> 0x18,0));
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  Imath_2_5::Rand48::Rand48
            ((Rand48 *)in_stack_fffffffffffffc40,
             CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  poVar2 = std::operator<<((ostream *)&std::cout,"    generating random pixel values");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  fillChannels((Rand48 *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  Imath_2_5::Vec2<float>::Vec2(local_110,0.0,0.0);
  Imf_2_5::Header::Header
            (in_stack_fffffffffffffca0,(int)((ulong)in_stack_fffffffffffffc98 >> 0x20),
             (int)in_stack_fffffffffffffc98,in_stack_fffffffffffffc94,in_stack_fffffffffffffc88,
             (float)((ulong)in_stack_fffffffffffffc80 >> 0x20),(LineOrder)in_stack_fffffffffffffc80,
             in_stack_fffffffffffffc7c);
  Imath_2_5::Vec2<int>::Vec2(local_128,0x28,0x32);
  Imath_2_5::Vec2<int>::Vec2(&local_130,0x3c,0x46);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            ((Box<Imath_2_5::Vec2<int>_> *)in_stack_fffffffffffffc50,
             (Vec2<int> *)in_stack_fffffffffffffc48,&in_stack_fffffffffffffc40->min);
  Imf_2_5::Header::dataWindow((Header *)0x119ca2);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator=
            (in_stack_fffffffffffffc40,
             (Box<Imath_2_5::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  poVar2 = std::operator<<((ostream *)&std::cout,"    saving scan line file");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imf_2_5::saveDeepScanLineImage
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffeac);
  poVar2 = std::operator<<((ostream *)&std::cout,"    loading file");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imf_2_5::DeepImage::DeepImage((DeepImage *)in_stack_fffffffffffffc70);
  Imf_2_5::loadDeepImage((string *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  Imf_2_5::Image::dataWindow((Image *)(local_1b8 + 0x20));
  Imf_2_5::Image::dataWindow(&local_70);
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator!=
                    ((Box<Imath_2_5::Vec2<int>_> *)in_stack_fffffffffffffc50,
                     (Box<Imath_2_5::Vec2<int>_> *)in_stack_fffffffffffffc48);
  if (!bVar1) {
    __assert_fail("img2.dataWindow() != img1.dataWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfUtilTest/testDeepImage.cpp"
                  ,0x23d,"void (anonymous namespace)::testCropping(const string &)");
  }
  Imf_2_5::Image::dataWindow((Image *)(local_1b8 + 0x20));
  Imf_2_5::Header::dataWindow((Header *)0x119ea8);
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                    ((Box<Imath_2_5::Vec2<int>_> *)in_stack_fffffffffffffc50,
                     (Box<Imath_2_5::Vec2<int>_> *)in_stack_fffffffffffffc48);
  if (!bVar1) {
    __assert_fail("img2.dataWindow() == hdr.dataWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfUtilTest/testDeepImage.cpp"
                  ,0x23e,"void (anonymous namespace)::testCropping(const string &)");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"    comparing");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imf_2_5::DeepImage::level((DeepImage *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc80,
             (char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70);
  Imf_2_5::DeepImageLevel::channel(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  Imf_2_5::DeepImage::level((DeepImage *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
  c1 = (DeepImageChannel *)&stack0xfffffffffffffe1f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc80,
             (char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70);
  c2 = Imf_2_5::DeepImageLevel::channel(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  verifyPixelsAreEqual<half>
            (c1,c2,(int)((ulong)in_stack_fffffffffffffcb0 >> 0x20),(int)in_stack_fffffffffffffcb0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe20);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe1f);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  poVar2 = std::operator<<((ostream *)&std::cout,"    saving tiled file");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imf_2_5::saveDeepTiledImage
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe1c);
  poVar3 = std::operator<<((ostream *)&std::cout,"    loading file");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  Imf_2_5::DeepImage::DeepImage((DeepImage *)in_stack_fffffffffffffc70);
  Imf_2_5::loadDeepImage((string *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  Imf_2_5::Image::dataWindow(&local_250);
  Imf_2_5::Image::dataWindow(&local_70);
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator!=
                    ((Box<Imath_2_5::Vec2<int>_> *)in_stack_fffffffffffffc50,
                     (Box<Imath_2_5::Vec2<int>_> *)in_stack_fffffffffffffc48);
  if (!bVar1) {
    __assert_fail("img3.dataWindow() != img1.dataWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfUtilTest/testDeepImage.cpp"
                  ,0x24e,"void (anonymous namespace)::testCropping(const string &)");
  }
  Imf_2_5::Image::dataWindow(&local_250);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         Imf_2_5::Header::dataWindow((Header *)0x11a22e);
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                    ((Box<Imath_2_5::Vec2<int>_> *)in_stack_fffffffffffffc50,
                     (Box<Imath_2_5::Vec2<int>_> *)in_stack_fffffffffffffc48);
  uVar4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc7c);
  if (!bVar1) {
    __assert_fail("img3.dataWindow() == hdr.dataWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfUtilTest/testDeepImage.cpp"
                  ,0x24f,"void (anonymous namespace)::testCropping(const string &)");
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"    comparing");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  Imf_2_5::DeepImage::level((DeepImage *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)CONCAT44(uVar4,in_stack_fffffffffffffc78),(allocator<char> *)poVar3);
  Imf_2_5::DeepImageLevel::channel(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  this_00 = Imf_2_5::DeepImage::level
                      ((DeepImage *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
  name = (string *)local_299;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)CONCAT44(uVar4,in_stack_fffffffffffffc78),(allocator<char> *)poVar3);
  Imf_2_5::DeepImageLevel::channel(this_00,name);
  verifyPixelsAreEqual<half>(c1,c2,(int)((ulong)poVar2 >> 0x20),(int)poVar2);
  std::__cxx11::string::~string((string *)(local_299 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_299);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator(&local_271);
  __filename = (char *)std::__cxx11::string::c_str();
  remove(__filename);
  Imf_2_5::DeepImage::~DeepImage((DeepImage *)0x11a3c5);
  Imf_2_5::DeepImage::~DeepImage((DeepImage *)0x11a3d2);
  Imf_2_5::Header::~Header((Header *)this_00);
  Imf_2_5::DeepImage::~DeepImage((DeepImage *)0x11a3ec);
  return;
}

Assistant:

void
testCropping (const string &fileName)
{
    cout << "cropping an image" << endl;

    FlatImage img1 (Box2i (V2i (10, 20), V2i (110, 120)), ONE_LEVEL);
    img1.insertChannel ("A", HALF);

    Rand48 random (0);
    cout << "    generating random pixel values" << endl;
    fillChannels (random, img1);

    Header hdr;
    hdr.dataWindow() = Box2i (V2i (40, 50), V2i (60, 70));

    cout << "    saving scan line file" << endl;
    saveFlatScanLineImage (fileName, hdr, img1, USE_HEADER_DATA_WINDOW);

    cout << "    loading file" << endl;
    FlatImage img2;
    loadFlatImage (fileName, img2);

    assert (img2.dataWindow() != img1.dataWindow());
    assert (img2.dataWindow() == hdr.dataWindow());

    cout << "    comparing" << endl;

    verifyPixelsAreEqual <half> (img2.level().channel ("A"),
                                 img1.level().channel ("A"),
                                 0, 0);


    cout << "    saving tiled file" << endl;
    saveFlatTiledImage (fileName, hdr, img1, USE_HEADER_DATA_WINDOW);

    cout << "    loading file" << endl;
    FlatImage img3;
    loadFlatImage (fileName, img3);

    assert (img3.dataWindow() != img1.dataWindow());
    assert (img3.dataWindow() == hdr.dataWindow());

    cout << "    comparing" << endl;

    verifyPixelsAreEqual <half> (img3.level(0).channel ("A"),
                                 img1.level(0).channel ("A"),
                                 0, 0);
    remove (fileName.c_str ());
}